

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

uint __thiscall nv::ColorBlock::countUniqueColors(ColorBlock *this)

{
  uint uVar1;
  int i;
  long lVar2;
  byte bVar3;
  int j;
  long lVar4;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    bVar3 = 1;
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      if (this->m_color[lVar2].field_0.u != this->m_color[lVar4].field_0.u) {
        bVar3 = 0;
      }
    }
    uVar1 = uVar1 + bVar3;
  }
  return uVar1;
}

Assistant:

uint ColorBlock::countUniqueColors() const
{
	uint count = 0;

	// @@ This does not have to be o(n^2)
	for(int i = 0; i < 16; i++)
	{
		bool unique = true;
		for(int j = 0; j < i; j++) {
			if( m_color[i] != m_color[j] ) {
				unique = false;
			}
		}
		
		if( unique ) {
			count++;
		}
	}
	
	return count;
}